

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbarlayout.cpp
# Opt level: O0

QLayoutItem * __thiscall QToolBarLayout::takeAt(QToolBarLayout *this,int index)

{
  QWidget *this_00;
  qsizetype qVar1;
  QToolBarItem *this_01;
  QWidgetAction *pQVar2;
  int in_ESI;
  QList<QToolBarItem_*> *in_RDI;
  QWidgetAction *widgetAction;
  QToolBarItem *item;
  undefined4 in_stack_ffffffffffffffe8;
  QAction *in_stack_fffffffffffffff8;
  
  if (-1 < in_ESI) {
    this_00 = (QWidget *)(long)in_ESI;
    qVar1 = QList<QToolBarItem_*>::size((QList<QToolBarItem_*> *)&in_RDI[1].d.ptr);
    if ((long)this_00 < qVar1) {
      this_01 = QList<QToolBarItem_*>::takeAt(in_RDI,(qsizetype)this_00);
      if (in_RDI[5].d.ptr != (QToolBarItem **)0x0) {
        QWidget::removeAction(this_00,in_stack_fffffffffffffff8);
      }
      pQVar2 = qobject_cast<QWidgetAction*>((QObject *)0x6fcbd7);
      if ((pQVar2 == (QWidgetAction *)0x0) || ((this_01->customWidget & 1U) == 0)) {
        (*(this_01->super_QWidgetItem).super_QLayoutItem._vptr_QLayoutItem[0xd])();
        QWidget::hide((QWidget *)0x6fcc26);
        (*(this_01->super_QWidgetItem).super_QLayoutItem._vptr_QLayoutItem[0xd])();
        QObject::deleteLater();
      }
      else {
        (*(this_01->super_QWidgetItem).super_QLayoutItem._vptr_QLayoutItem[0xd])();
        QWidgetAction::releaseWidget
                  ((QWidgetAction *)this_01,(QWidget *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
      }
      (**(code **)&(in_RDI->d).d[7].super_QArrayData)();
      return (QLayoutItem *)this_01;
    }
  }
  return (QLayoutItem *)0x0;
}

Assistant:

QLayoutItem *QToolBarLayout::takeAt(int index)
{
    if (index < 0 || index >= items.size())
        return nullptr;
    QToolBarItem *item = items.takeAt(index);

    if (popupMenu)
        popupMenu->removeAction(item->action);

    QWidgetAction *widgetAction = qobject_cast<QWidgetAction*>(item->action);
    if (widgetAction != nullptr && item->customWidget) {
        widgetAction->releaseWidget(item->widget());
    } else {
        // destroy the QToolButton/QToolBarSeparator
        item->widget()->hide();
        item->widget()->deleteLater();
    }

    invalidate();
    return item;
}